

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GaussianPuffRecord.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::DATA_TYPE::GaussianPuffRecord::operator==(GaussianPuffRecord *this,GaussianPuffRecord *Value)

{
  KBOOL KVar1;
  GaussianPuffRecord *Value_local;
  GaussianPuffRecord *this_local;
  
  KVar1 = EnvironmentRecord::operator!=
                    (&this->super_EnvironmentRecord,&Value->super_EnvironmentRecord);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else {
    KVar1 = WorldCoordinates::operator!=(&this->m_PuffLocation,&Value->m_PuffLocation);
    if (KVar1) {
      this_local._7_1_ = false;
    }
    else {
      KVar1 = WorldCoordinates::operator!=(&this->m_OrigLocation,&Value->m_OrigLocation);
      if (KVar1) {
        this_local._7_1_ = false;
      }
      else {
        KVar1 = Vector::operator!=(&this->m_Sigma,&Value->m_Sigma);
        if (KVar1) {
          this_local._7_1_ = false;
        }
        else {
          KVar1 = Vector::operator!=(&this->m_DDTSigma,&Value->m_DDTSigma);
          if (KVar1) {
            this_local._7_1_ = false;
          }
          else {
            KVar1 = EulerAngles::operator!=(&this->m_Ori,&Value->m_Ori);
            if (KVar1) {
              this_local._7_1_ = false;
            }
            else {
              KVar1 = Vector::operator!=(&this->m_Velocity,&Value->m_Velocity);
              if (KVar1) {
                this_local._7_1_ = false;
              }
              else {
                KVar1 = Vector::operator!=(&this->m_AngularVelocity,&Value->m_AngularVelocity);
                if (KVar1) {
                  this_local._7_1_ = false;
                }
                else if (((float)this->m_f32CentHeight != (float)Value->m_f32CentHeight) ||
                        (NAN((float)this->m_f32CentHeight) || NAN((float)Value->m_f32CentHeight))) {
                  this_local._7_1_ = false;
                }
                else {
                  this_local._7_1_ = true;
                }
              }
            }
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

KBOOL GaussianPuffRecord::operator == ( const GaussianPuffRecord & Value )const
{
    if( EnvironmentRecord::operator !=( Value ) )       return false;
    if( m_PuffLocation     != Value.m_PuffLocation )    return false;
    if( m_OrigLocation     != Value.m_OrigLocation )    return false;
    if( m_Sigma            != Value.m_Sigma )           return false;
    if( m_DDTSigma         != Value.m_DDTSigma )        return false;
    if( m_Ori              != Value.m_Ori )             return false;
    if( m_Velocity         != Value.m_Velocity )        return false;
    if( m_AngularVelocity  != Value.m_AngularVelocity ) return false;
    if( m_f32CentHeight    != Value.m_f32CentHeight )   return false;
    return true;
}